

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

int main(void)

{
  uint __line;
  uchar *puVar1;
  uchar *puVar2;
  ostream *poVar3;
  Buffer *pBVar4;
  size_t sVar5;
  logic_error *this;
  size_t in_RCX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  EVP_PKEY_CTX *src_02;
  char *__assertion;
  uchar *mbuf;
  Buffer bc3;
  size_t len;
  Buffer b1;
  Buffer bm4;
  Buffer bm1;
  Buffer bc4;
  Buffer bc2;
  Buffer bc1;
  Buffer bm5;
  Buffer bm2;
  Buffer bm6;
  Buffer bm3;
  Pl_Count count;
  Pl_Buffer bp1;
  Pl_Buffer bp4;
  Pl_Buffer bp3;
  Pl_Buffer bp2;
  uchar lbuf [10];
  Pl_Discard discard;
  
  Buffer::Buffer(&bc1,2);
  puVar1 = Buffer::getBuffer(&bc1);
  puVar1[0] = 'Q';
  puVar1[1] = 'W';
  Buffer::copy(&bc2,(EVP_PKEY_CTX *)&bc1,src);
  *puVar1 = 'R';
  puVar2 = Buffer::getBuffer(&bc2);
  if (puVar2 == puVar1) {
    __assertion = "bc2p != bc1p";
    __line = 0x1d;
  }
  else if (*puVar2 == 'Q') {
    if (puVar2[1] == 'W') {
      Buffer::copy((Buffer *)&count,(EVP_PKEY_CTX *)&bc1,src_00);
      Buffer::operator=(&bc2,(Buffer *)&count);
      Buffer::~Buffer((Buffer *)&count);
      puVar2 = Buffer::getBuffer(&bc2);
      if (puVar2 == puVar1) {
        __assertion = "bc2p != bc1p";
        __line = 0x22;
      }
      else if (*puVar2 == 'R') {
        if (puVar2[1] == 'W') {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&count,"QW",(allocator<char> *)&bp1);
          Buffer::Buffer(&bc3,(string *)&count);
          std::__cxx11::string::~string((string *)&count);
          puVar1 = Buffer::getBuffer(&bc3);
          Buffer::copy(&bc4,(EVP_PKEY_CTX *)&bc3,src_01);
          *puVar1 = 'R';
          puVar2 = Buffer::getBuffer(&bc4);
          if (puVar2 == puVar1) {
            __assertion = "bc4p != bc3p";
            __line = 0x2c;
          }
          else if (*puVar2 == 'Q') {
            if (puVar2[1] == 'W') {
              Buffer::copy((Buffer *)&count,(EVP_PKEY_CTX *)&bc3,src_02);
              Buffer::operator=(&bc4,(Buffer *)&count);
              Buffer::~Buffer((Buffer *)&count);
              puVar2 = Buffer::getBuffer(&bc4);
              if (puVar2 == puVar1) {
                __assertion = "bc4p != bc3p";
                __line = 0x31;
              }
              else if (*puVar2 == 'R') {
                if (puVar2[1] == 'W') {
                  Buffer::Buffer(&bm1,2);
                  puVar1 = Buffer::getBuffer(&bm1);
                  puVar1[0] = 'Q';
                  puVar1[1] = 'W';
                  Buffer::Buffer(&bm2,&bm1);
                  *puVar1 = 'R';
                  puVar2 = Buffer::getBuffer(&bm2);
                  if (puVar2 == puVar1) {
                    if (*puVar2 == 'R') {
                      Buffer::Buffer(&bm3,&bm2);
                      puVar2 = Buffer::getBuffer(&bm3);
                      if (puVar2 == puVar1) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&count,"QW",(allocator<char> *)&bp1);
                        Buffer::Buffer(&bm4,(string *)&count);
                        std::__cxx11::string::~string((string *)&count);
                        puVar1 = Buffer::getBuffer(&bm4);
                        Buffer::Buffer(&bm5,&bm4);
                        *puVar1 = 'R';
                        puVar2 = Buffer::getBuffer(&bm5);
                        if (puVar2 == puVar1) {
                          if (*puVar2 == 'R') {
                            Buffer::Buffer(&bm6,&bm5);
                            puVar2 = Buffer::getBuffer(&bm6);
                            if (puVar2 == puVar1) {
                              Pl_Discard::Pl_Discard(&discard);
                              Pl_Count::Pl_Count(&count,"count",&discard.super_Pipeline);
                              Pl_Buffer::Pl_Buffer(&bp1,"bp1",&count.super_Pipeline);
                              puVar1 = QUtil::unsigned_char_pointer("12345");
                              Pl_Buffer::write(&bp1,(int)puVar1,(void *)0x5,in_RCX);
                              puVar1 = QUtil::unsigned_char_pointer("67890");
                              Pl_Buffer::write(&bp1,(int)puVar1,(void *)0x5,in_RCX);
                              Pl_Buffer::finish(&bp1);
                              poVar3 = std::operator<<((ostream *)&std::cout,"count: ");
                              Pl_Count::getCount(&count);
                              poVar3 = std::ostream::_M_insert<long_long>((longlong)poVar3);
                              std::endl<char,std::char_traits<char>>(poVar3);
                              puVar1 = QUtil::unsigned_char_pointer("abcde");
                              Pl_Buffer::write(&bp1,(int)puVar1,(void *)0x5,in_RCX);
                              puVar1 = QUtil::unsigned_char_pointer("fghij");
                              Pl_Buffer::write(&bp1,(int)puVar1,(void *)0x6,in_RCX);
                              Pl_Buffer::finish(&bp1);
                              poVar3 = std::operator<<((ostream *)&std::cout,"count: ");
                              Pl_Count::getCount(&count);
                              poVar3 = std::ostream::_M_insert<long_long>((longlong)poVar3);
                              std::endl<char,std::char_traits<char>>(poVar3);
                              pBVar4 = Pl_Buffer::getBuffer(&bp1);
                              poVar3 = std::operator<<((ostream *)&std::cout,"size: ");
                              Buffer::getSize(pBVar4);
                              poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
                              std::endl<char,std::char_traits<char>>(poVar3);
                              poVar3 = std::operator<<((ostream *)&std::cout,"data: ");
                              puVar1 = Buffer::getBuffer(pBVar4);
                              poVar3 = std::operator<<(poVar3,(char *)puVar1);
                              std::endl<char,std::char_traits<char>>(poVar3);
                              Buffer::~Buffer(pBVar4);
                              operator_delete(pBVar4,8);
                              puVar1 = QUtil::unsigned_char_pointer("qwert");
                              Pl_Buffer::write(&bp1,(int)puVar1,(void *)0x5,in_RCX);
                              puVar1 = QUtil::unsigned_char_pointer("yuiop");
                              Pl_Buffer::write(&bp1,(int)puVar1,(void *)0x6,in_RCX);
                              Pl_Buffer::finish(&bp1);
                              poVar3 = std::operator<<((ostream *)&std::cout,"count: ");
                              Pl_Count::getCount(&count);
                              poVar3 = std::ostream::_M_insert<long_long>((longlong)poVar3);
                              std::endl<char,std::char_traits<char>>(poVar3);
                              pBVar4 = Pl_Buffer::getBuffer(&bp1);
                              poVar3 = std::operator<<((ostream *)&std::cout,"size: ");
                              Buffer::getSize(pBVar4);
                              poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
                              std::endl<char,std::char_traits<char>>(poVar3);
                              poVar3 = std::operator<<((ostream *)&std::cout,"data: ");
                              puVar1 = Buffer::getBuffer(pBVar4);
                              poVar3 = std::operator<<(poVar3,(char *)puVar1);
                              std::endl<char,std::char_traits<char>>(poVar3);
                              Buffer::~Buffer(pBVar4);
                              operator_delete(pBVar4,8);
                              Pl_Buffer::Pl_Buffer(&bp2,"bp2",(Pipeline *)0x0);
                              puVar1 = QUtil::unsigned_char_pointer("moo");
                              Pl_Buffer::write(&bp2,(int)puVar1,(void *)0x3,in_RCX);
                              puVar1 = QUtil::unsigned_char_pointer("quack");
                              Pl_Buffer::write(&bp2,(int)puVar1,(void *)0x6,in_RCX);
                              pBVar4 = Pl_Buffer::getBuffer(&bp2);
                              if (pBVar4 != (Buffer *)0x0) {
                                Buffer::~Buffer(pBVar4);
                              }
                              operator_delete(pBVar4,8);
                              Pl_Buffer::finish(&bp2);
                              pBVar4 = Pl_Buffer::getBuffer(&bp2);
                              poVar3 = std::operator<<((ostream *)&std::cout,"size: ");
                              Buffer::getSize(pBVar4);
                              poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
                              std::endl<char,std::char_traits<char>>(poVar3);
                              poVar3 = std::operator<<((ostream *)&std::cout,"data: ");
                              puVar1 = Buffer::getBuffer(pBVar4);
                              poVar3 = std::operator<<(poVar3,(char *)puVar1);
                              std::endl<char,std::char_traits<char>>(poVar3);
                              Buffer::~Buffer(pBVar4);
                              operator_delete(pBVar4,8);
                              Buffer::Buffer(&b1,lbuf,10);
                              puVar1 = Buffer::getBuffer(&b1);
                              if (puVar1 == lbuf) {
                                sVar5 = Buffer::getSize(&b1);
                                if (sVar5 == 10) {
                                  Pl_Buffer::Pl_Buffer(&bp3,"bp3",(Pipeline *)0x0);
                                  pBVar4 = Pl_Buffer::getBuffer(&bp3);
                                  poVar3 = std::operator<<((ostream *)&std::cout,"size: ");
                                  Buffer::getSize(pBVar4);
                                  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
                                  std::endl<char,std::char_traits<char>>(poVar3);
                                  Buffer::~Buffer(pBVar4);
                                  operator_delete(pBVar4,8);
                                  pBVar4 = Pl_Buffer::getBuffer(&bp3);
                                  poVar3 = std::operator<<((ostream *)&std::cout,"size: ");
                                  Buffer::getSize(pBVar4);
                                  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
                                  std::endl<char,std::char_traits<char>>(poVar3);
                                  Buffer::~Buffer(pBVar4);
                                  operator_delete(pBVar4,8);
                                  puVar1 = QUtil::unsigned_char_pointer("");
                                  Pl_Buffer::write(&bp3,(int)puVar1,(void *)0x0,in_RCX);
                                  Pl_Buffer::finish(&bp3);
                                  pBVar4 = Pl_Buffer::getBuffer(&bp3);
                                  poVar3 = std::operator<<((ostream *)&std::cout,"size: ");
                                  Buffer::getSize(pBVar4);
                                  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
                                  std::endl<char,std::char_traits<char>>(poVar3);
                                  Buffer::~Buffer(pBVar4);
                                  operator_delete(pBVar4,8);
                                  Pl_Buffer::Pl_Buffer(&bp4,"bp4",(Pipeline *)0x0);
                                  puVar1 = QUtil::unsigned_char_pointer("asdf");
                                  Pl_Buffer::write(&bp4,(int)puVar1,(void *)0x4,in_RCX);
                                  Pl_Buffer::getMallocBuffer(&bp4,&mbuf,&len);
                                  __assert_fail("false",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                                                ,0x94,"int main()");
                                }
                              }
                              this = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error
                                        (this,"hand-created buffer is not as expected");
                              __cxa_throw(this,&std::logic_error::typeinfo,
                                          std::logic_error::~logic_error);
                            }
                            __assertion = "bm6p == bm5p";
                            __line = 0x4f;
                          }
                          else {
                            __assertion = "bm5p[0] == \'R\'";
                            __line = 0x4b;
                          }
                        }
                        else {
                          __assertion = "bm5p == bm4p";
                          __line = 0x4a;
                        }
                      }
                      else {
                        __assertion = "bm3p == bm2p";
                        __line = 0x42;
                      }
                    }
                    else {
                      __assertion = "bm2p[0] == \'R\'";
                      __line = 0x3e;
                    }
                  }
                  else {
                    __assertion = "bm2p == bm1p";
                    __line = 0x3d;
                  }
                }
                else {
                  __assertion = "bc4p[1] == \'W\'";
                  __line = 0x33;
                }
              }
              else {
                __assertion = "bc4p[0] == \'R\'";
                __line = 0x32;
              }
            }
            else {
              __assertion = "bc4p[1] == \'W\'";
              __line = 0x2e;
            }
          }
          else {
            __assertion = "bc4p[0] == \'Q\'";
            __line = 0x2d;
          }
        }
        else {
          __assertion = "bc2p[1] == \'W\'";
          __line = 0x24;
        }
      }
      else {
        __assertion = "bc2p[0] == \'R\'";
        __line = 0x23;
      }
    }
    else {
      __assertion = "bc2p[1] == \'W\'";
      __line = 0x1f;
    }
  }
  else {
    __assertion = "bc2p[0] == \'Q\'";
    __line = 0x1e;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                ,__line,"int main()");
}

Assistant:

int
main()
{
    // Test that buffers can be copied by value using Buffer::copy.
    Buffer bc1(2);
    unsigned char* bc1p = bc1.getBuffer();
    bc1p[0] = 'Q';
    bc1p[1] = 'W';
    Buffer bc2(bc1.copy());
    bc1p[0] = 'R';
    unsigned char* bc2p = bc2.getBuffer();
    assert(bc2p != bc1p);
    assert(bc2p[0] == 'Q');
    assert(bc2p[1] == 'W');
    bc2 = bc1.copy();
    bc2p = bc2.getBuffer();
    assert(bc2p != bc1p);
    assert(bc2p[0] == 'R');
    assert(bc2p[1] == 'W');

    // Test Buffer(std:string&&)
    Buffer bc3("QW");
    unsigned char* bc3p = bc3.getBuffer();
    Buffer bc4(bc3.copy());
    bc3p[0] = 'R';
    unsigned char* bc4p = bc4.getBuffer();
    assert(bc4p != bc3p);
    assert(bc4p[0] == 'Q');
    assert(bc4p[1] == 'W');
    bc4 = bc3.copy();
    bc4p = bc4.getBuffer();
    assert(bc4p != bc3p);
    assert(bc4p[0] == 'R');
    assert(bc4p[1] == 'W');

    // Test that buffers can be moved.
    Buffer bm1(2);
    unsigned char* bm1p = bm1.getBuffer();
    bm1p[0] = 'Q';
    bm1p[1] = 'W';
    Buffer bm2(std::move(bm1));
    bm1p[0] = 'R';
    unsigned char* bm2p = bm2.getBuffer();
    assert(bm2p == bm1p);
    assert(bm2p[0] == 'R');

    Buffer bm3 = std::move(bm2);
    unsigned char* bm3p = bm3.getBuffer();
    assert(bm3p == bm2p);

    // Test Buffer(dtd::string&&)
    Buffer bm4("QW");
    unsigned char* bm4p = bm4.getBuffer();
    Buffer bm5(std::move(bm4));
    bm4p[0] = 'R';
    unsigned char* bm5p = bm5.getBuffer();
    assert(bm5p == bm4p);
    assert(bm5p[0] == 'R');

    Buffer bm6 = std::move(bm5);
    unsigned char* bm6p = bm6.getBuffer();
    assert(bm6p == bm5p);

    try {
        Pl_Discard discard;
        Pl_Count count("count", &discard);
        Pl_Buffer bp1("bp1", &count);
        bp1.write(uc("12345"), 5);
        bp1.write(uc("67890"), 5);
        bp1.finish();
        std::cout << "count: " << count.getCount() << std::endl;
        bp1.write(uc("abcde"), 5);
        bp1.write(uc("fghij"), 6);
        bp1.finish();
        std::cout << "count: " << count.getCount() << std::endl;
        Buffer* b = bp1.getBuffer();
        std::cout << "size: " << b->getSize() << std::endl;
        std::cout << "data: " << b->getBuffer() << std::endl;
        delete b;
        bp1.write(uc("qwert"), 5);
        bp1.write(uc("yuiop"), 6);
        bp1.finish();
        std::cout << "count: " << count.getCount() << std::endl;
        b = bp1.getBuffer();
        std::cout << "size: " << b->getSize() << std::endl;
        std::cout << "data: " << b->getBuffer() << std::endl;
        delete b;

        Pl_Buffer bp2("bp2");
        bp2.write(uc("moo"), 3);
        bp2.write(uc("quack"), 6);
        try {
            delete bp2.getBuffer();
        } catch (std::exception& e) {
            std::cout << e.what() << std::endl;
        }
        bp2.finish();
        b = bp2.getBuffer();
        std::cout << "size: " << b->getSize() << std::endl;
        std::cout << "data: " << b->getBuffer() << std::endl;
        delete b;

        unsigned char lbuf[10];
        Buffer b1(lbuf, 10);
        if (!((b1.getBuffer() == lbuf) && (b1.getSize() == 10))) {
            throw std::logic_error("hand-created buffer is not as expected");
        }

        Pl_Buffer bp3("bp3");
        b = bp3.getBuffer();
        std::cout << "size: " << b->getSize() << std::endl;
        delete b;
        // Should be able to call getBuffer again and get an empty buffer
        b = bp3.getBuffer();
        std::cout << "size: " << b->getSize() << std::endl;
        delete b;
        // Also can write 0 and do it.
        bp3.write(uc(""), 0);
        bp3.finish();
        b = bp3.getBuffer();
        std::cout << "size: " << b->getSize() << std::endl;
        delete b;

        // Malloc buffer should behave similarly.
        Pl_Buffer bp4("bp4");
        bp4.write(uc("asdf"), 4);
        unsigned char* mbuf;
        size_t len;
        try {
            bp4.getMallocBuffer(&mbuf, &len);
            assert(false);
        } catch (std::logic_error& e) {
            std::cout << "malloc buffer logic error: " << e.what() << std::endl;
        }
        bp4.finish();
        bp4.getMallocBuffer(&mbuf, &len);
        assert(len == 4);
        assert(memcmp(mbuf, uc("asdf"), 4) == 0);
        free(mbuf);
        bp4.write(uc(""), 0);
        bp4.finish();
        bp4.getMallocBuffer(&mbuf, &len);
        assert(mbuf == nullptr);
        assert(len == 0);
    } catch (std::exception& e) {
        std::cout << "unexpected exception: " << e.what() << std::endl;
        exit(2);
    }

    std::cout << "done" << std::endl;
    return 0;
}